

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  long lVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  parse_buffer *input_buffer;
  long in_FS_OFFSET;
  cJSON *local_80;
  cJSON *item;
  cJSON_bool require_null_terminated_local;
  char **return_parse_end_local;
  char *value_local;
  error local_error;
  parse_buffer buffer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_error.position,0,0x38);
  local_80 = (cJSON *)0x0;
  global_error.json = (uchar *)0x0;
  global_error.position = 0;
  if (value != (char *)0x0) {
    local_error.position = (size_t)value;
    sVar3 = strlen(value);
    buffer.content = (uchar *)(sVar3 + 1);
    buffer.length = 0;
    local_80 = cJSON_New_Item(&global_hooks);
    if (local_80 != (cJSON *)0x0) {
      input_buffer = buffer_skip_whitespace((parse_buffer *)&local_error.position);
      cVar2 = parse_value(local_80,input_buffer);
      if ((cVar2 != 0) &&
         ((require_null_terminated == 0 ||
          ((buffer_skip_whitespace((parse_buffer *)&local_error.position),
           buffer.content != (uchar *)0x0 && (*(char *)local_error.position == '\0')))))) {
        value_local = (char *)local_80;
        if (return_parse_end != (char **)0x0) {
          *return_parse_end = (char *)local_error.position;
        }
        goto LAB_00102675;
      }
    }
  }
  if (local_80 != (cJSON *)0x0) {
    cJSON_Delete(local_80);
  }
  if (value != (char *)0x0) {
    local_error.json = (uchar *)0x0;
    if (buffer.length < buffer.content) {
      local_error.json = (uchar *)buffer.length;
    }
    else if (buffer.content != (uchar *)0x0) {
      local_error.json = buffer.content + -1;
    }
    if (return_parse_end == (char **)0x0) {
      global_error.position = (size_t)local_error.json;
      global_error.json = (uchar *)value;
    }
    else {
      *return_parse_end = value + (long)local_error.json;
    }
  }
  value_local = (char *)0x0;
LAB_00102675:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (cJSON *)value_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(&buffer)))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }
        else
        {
            global_error = local_error;
        }
    }

    return NULL;
}